

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

type_t pugi::impl::anon_unknown_0::xpath_sort
                 (xpath_node *begin,xpath_node *end,type_t type,bool rev)

{
  xpath_node *lhs;
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  bool bVar4;
  bool bVar5;
  type_t tVar6;
  undefined3 in_register_00000009;
  undefined4 in_register_00000014;
  xpath_node *extraout_RDX;
  xpath_node *pred;
  xpath_node *pxVar7;
  long lVar8;
  xpath_node *this;
  
  pxVar7 = (xpath_node *)CONCAT44(in_register_00000014,type);
  tVar6 = CONCAT31(in_register_00000009,rev) + type_sorted;
  lVar8 = (long)end - (long)begin;
  if (type == type_unsorted) {
    if (lVar8 < 0x11) {
      return tVar6;
    }
    bVar4 = document_order_comparator::operator()
                      ((document_order_comparator *)begin,begin + 1,pxVar7);
    pxVar7 = extraout_RDX;
    this = begin + 1;
    do {
      lhs = this + 1;
      if (end <= lhs) {
        pxVar7 = (xpath_node *)(ulong)(2 - bVar4);
        goto LAB_0015d486;
      }
      bVar5 = document_order_comparator::operator()((document_order_comparator *)this,lhs,pxVar7);
      pxVar7 = pred;
      this = lhs;
    } while (bVar4 == bVar5);
    (anonymous_namespace)::
    sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (begin,end,(document_order_comparator *)pred);
    pxVar7 = (xpath_node *)0x1;
  }
LAB_0015d486:
  if (0x10 < lVar8 && (type_t)pxVar7 != tVar6) {
    pxVar7 = end + -1;
    do {
      pxVar1 = (begin->_node)._root;
      pxVar2 = (begin->_attribute)._attr;
      pxVar3 = (pxVar7->_attribute)._attr;
      (begin->_node)._root = (pxVar7->_node)._root;
      (begin->_attribute)._attr = pxVar3;
      begin = begin + 1;
      (pxVar7->_node)._root = pxVar1;
      (pxVar7->_attribute)._attr = pxVar2;
      lVar8 = lVar8 + -0x20;
      pxVar7 = pxVar7 + -1;
    } while (0x10 < lVar8);
  }
  return tVar6;
}

Assistant:

PUGI_IMPL_FN xpath_node_set::type_t xpath_sort(xpath_node* begin, xpath_node* end, xpath_node_set::type_t type, bool rev)
	{
		xpath_node_set::type_t order = rev ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

		if (type == xpath_node_set::type_unsorted)
		{
			xpath_node_set::type_t sorted = xpath_get_order(begin, end);

			if (sorted == xpath_node_set::type_unsorted)
			{
				sort(begin, end, document_order_comparator());

				type = xpath_node_set::type_sorted;
			}
			else
				type = sorted;
		}

		if (type != order) reverse(begin, end);

		return order;
	}